

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Rotl_i32(w3Interp *this)

{
  int32_t iVar1;
  uint32_t *puVar2;
  uint32_t a;
  uint32_t *r;
  int32_t b;
  int n;
  w3Interp *this_local;
  
  iVar1 = w3Stack::pop_i32(&this->super_w3Stack);
  puVar2 = w3Stack::u32(&this->super_w3Stack);
  *puVar2 = *puVar2 << ((byte)iVar1 & 0x1f) | *puVar2 >> (0x20 - ((byte)iVar1 & 0x1f) & 0x1f);
  return;
}

Assistant:

INTERP (Rotl_i32)
{
    const int n = 32;
    const int32_t b = (pop_i32 () & (n - 1));
    uint32_t& r = u32 ();
    uint32_t a = r;
#if _MSC_VER
    r = _rotl (a, b);
#else
    r = ((a << b) | (a >> (n - b)));
#endif
}